

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O2

Bitset * __thiscall
spirv_cross::ParsedIR::get_buffer_block_flags
          (Bitset *__return_storage_ptr__,ParsedIR *this,SPIRVariable *var)

{
  SPIRType *pSVar1;
  Meta *pMVar2;
  Bitset *pBVar3;
  uint32_t i;
  uint32_t index;
  Bitset all_members_flags;
  
  pSVar1 = get<spirv_cross::SPIRType>(this,*(uint32_t *)&(var->super_IVariant).field_0xc);
  if (*(int *)&(pSVar1->super_IVariant).field_0xc == 0xf) {
    __return_storage_ptr__->lower = 0;
    (__return_storage_ptr__->higher)._M_h._M_buckets =
         &(__return_storage_ptr__->higher)._M_h._M_single_bucket;
    (__return_storage_ptr__->higher)._M_h._M_bucket_count = 1;
    (__return_storage_ptr__->higher)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->higher)._M_h._M_element_count = 0;
    (__return_storage_ptr__->higher)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (__return_storage_ptr__->higher)._M_h._M_rehash_policy._M_next_resize = 0;
    (__return_storage_ptr__->higher)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    pMVar2 = find_meta(this,(ID)(var->super_IVariant).self.id);
    if (pMVar2 != (Meta *)0x0) {
      Bitset::operator=(__return_storage_ptr__,&(pMVar2->decoration).decoration_flags);
    }
    if ((pSVar1->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
        buffer_size != 0) {
      pBVar3 = get_member_decoration_bitset(this,(TypeID)(pSVar1->super_IVariant).self.id,0);
      Bitset::Bitset(&all_members_flags,pBVar3);
      for (index = 1;
          index < (uint)(pSVar1->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
          index = index + 1) {
        pBVar3 = get_member_decoration_bitset(this,(TypeID)(pSVar1->super_IVariant).self.id,index);
        Bitset::merge_and(&all_members_flags,pBVar3);
      }
      Bitset::merge_or(__return_storage_ptr__,&all_members_flags);
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&all_members_flags.higher._M_h);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("type.basetype == SPIRType::Struct",
                "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_cross_parsed_ir.cpp"
                ,0x214,
                "Bitset spirv_cross::ParsedIR::get_buffer_block_flags(const SPIRVariable &) const");
}

Assistant:

Bitset ParsedIR::get_buffer_block_flags(const SPIRVariable &var) const
{
	auto &type = get<SPIRType>(var.basetype);
	assert(type.basetype == SPIRType::Struct);

	// Some flags like non-writable, non-readable are actually found
	// as member decorations. If all members have a decoration set, propagate
	// the decoration up as a regular variable decoration.
	Bitset base_flags;
	auto *m = find_meta(var.self);
	if (m)
		base_flags = m->decoration.decoration_flags;

	if (type.member_types.empty())
		return base_flags;

	Bitset all_members_flags = get_member_decoration_bitset(type.self, 0);
	for (uint32_t i = 1; i < uint32_t(type.member_types.size()); i++)
		all_members_flags.merge_and(get_member_decoration_bitset(type.self, i));

	base_flags.merge_or(all_members_flags);
	return base_flags;
}